

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cc
# Opt level: O3

bool __thiscall
flow::Runtime::verifyNativeCalls(Runtime *this,IRProgram *program,IRBuilder *builder)

{
  IRHandler *pIVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  IRBuilder *pIVar4;
  char cVar5;
  pointer puVar6;
  long lVar7;
  Signature *pSVar8;
  NativeCallback *pNVar9;
  _List_node_base *p_Var10;
  long *plVar11;
  bool bVar12;
  long *plVar13;
  _Node *__tmp;
  list<std::pair<flow::Instr_*,_flow::NativeCallback_*>,_std::allocator<std::pair<flow::Instr_*,_flow::NativeCallback_*>_>_>
  calls;
  long *local_78;
  undefined1 *local_70;
  long local_68;
  IRBuilder *local_60;
  pointer local_58;
  pointer local_50;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *local_48;
  IRBuilder *local_40;
  long local_38;
  
  local_70 = (undefined1 *)&local_78;
  local_78 = (long *)&local_78;
  local_68 = 0;
  puVar6 = (program->handlers_).
           super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (program->handlers_).
             super__Vector_base<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>,_std::allocator<std::unique_ptr<flow::IRHandler,_std::default_delete<flow::IRHandler>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = builder;
  if (puVar6 == local_58) {
    bVar12 = true;
  }
  else {
    do {
      pIVar1 = (puVar6->_M_t).
               super___uniq_ptr_impl<flow::IRHandler,_std::default_delete<flow::IRHandler>_>._M_t.
               super__Tuple_impl<0UL,_flow::IRHandler_*,_std::default_delete<flow::IRHandler>_>.
               super__Head_base<0UL,_flow::IRHandler_*,_false>._M_head_impl;
      plVar11 = *(long **)&(pIVar1->blocks_).
                           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                           ._M_impl;
      local_48 = &pIVar1->blocks_;
      local_50 = puVar6;
      if ((list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           *)plVar11 != local_48) {
        do {
          plVar2 = *(long **)(plVar11[2] + 0x58);
          for (plVar13 = *(long **)(plVar11[2] + 0x50); plVar13 != plVar2; plVar13 = plVar13 + 1) {
            p_Var3 = (_List_node_base *)*plVar13;
            if (p_Var3 != (_List_node_base *)0x0) {
              lVar7 = __dynamic_cast(p_Var3,&Instr::typeinfo,&CallInstr::typeinfo,0);
              if (lVar7 == 0) {
                lVar7 = __dynamic_cast(p_Var3,&Instr::typeinfo,&HandlerCallInstr::typeinfo,0);
                if (lVar7 != 0) {
                  pSVar8 = NativeCallback::signature
                                     (*(NativeCallback **)(**(long **)(lVar7 + 0x50) + 0x48));
                  pNVar9 = find(this,pSVar8);
                  if (pNVar9 != (NativeCallback *)0x0) {
                    p_Var10 = (_List_node_base *)operator_new(0x20);
                    goto LAB_0016368f;
                  }
                }
              }
              else {
                pSVar8 = NativeCallback::signature
                                   (*(NativeCallback **)(**(long **)(lVar7 + 0x50) + 0x48));
                pNVar9 = find(this,pSVar8);
                if (pNVar9 != (NativeCallback *)0x0) {
                  p_Var10 = (_List_node_base *)operator_new(0x20);
LAB_0016368f:
                  p_Var10[1]._M_next = p_Var3;
                  p_Var10[1]._M_prev = (_List_node_base *)pNVar9;
                  std::__detail::_List_node_base::_M_hook(p_Var10);
                  local_68 = local_68 + 1;
                }
              }
            }
          }
          plVar11 = (long *)*plVar11;
        } while ((list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  *)plVar11 != local_48);
      }
      pIVar4 = local_60;
      puVar6 = local_50 + 1;
    } while (puVar6 != local_58);
    if ((long **)local_78 == &local_78) {
      bVar12 = true;
    }
    else {
      plVar11 = local_78;
      do {
        lVar7 = plVar11[3];
        if (*(long *)(lVar7 + 0x20) != 0) {
          local_38 = plVar11[2];
          local_40 = pIVar4;
          cVar5 = (**(code **)(lVar7 + 0x28))(lVar7 + 0x10,&local_38,&local_40);
          if (cVar5 == '\0') {
            bVar12 = false;
            goto LAB_00163737;
          }
        }
        plVar11 = (long *)*plVar11;
      } while ((long **)plVar11 != &local_78);
      bVar12 = true;
    }
LAB_00163737:
    plVar11 = local_78;
    if ((long **)local_78 != &local_78) {
      do {
        plVar13 = (long *)*plVar11;
        operator_delete(plVar11,0x20);
        plVar11 = plVar13;
      } while ((long **)plVar13 != &local_78);
    }
  }
  return bVar12;
}

Assistant:

bool Runtime::verifyNativeCalls(IRProgram* program, IRBuilder* builder) {
  std::list<std::pair<Instr*, NativeCallback*>> calls;

  for (IRHandler* handler : program->handlers()) {
    for (BasicBlock* bb : handler->basicBlocks()) {
      for (Instr* instr : bb->instructions()) {
        if (auto ci = dynamic_cast<CallInstr*>(instr)) {
          if (auto native = find(ci->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        } else if (auto hi = dynamic_cast<HandlerCallInstr*>(instr)) {
          if (auto native = find(hi->callee()->signature())) {
            calls.emplace_back(instr, native);
          }
        }
      }
    }
  }

  for (const std::pair<Instr*, NativeCallback*>& call : calls) {
    if (!call.second->verify(call.first, builder)) {
      return false;
    }
  }

  return true;
}